

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
::split(btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
        *this,int insert_position,
       btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
       *dest,allocator_type *alloc)

{
  field_type fVar1;
  byte bVar2;
  byte bVar3;
  btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
  **ppbVar4;
  btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
  *pbVar5;
  btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
  bVar6;
  btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
  i;
  map_slot_type<int,_const_google::protobuf::OneofDescriptor_*> *local_30;
  
  fVar1 = count(dest);
  if (fVar1 != '\0') {
    __assert_fail("dest->count() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x78e,
                  "void absl::container_internal::btree_node<absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>]"
                 );
  }
  if (((ulong)this & 7) == 0) {
    if ((this[0xb] !=
         (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
          )0x0) &&
       (this[0xb] !=
        (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
         )0xf)) {
      __assert_fail("max_count() == kNodeSlots",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                    ,0x78f,
                    "void absl::container_internal::btree_node<absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>]"
                   );
    }
    if (((ulong)dest & 7) == 0) {
      if ((byte)this[8] + 1 != (uint)(byte)dest[8]) {
        __assert_fail("position() + 1 == dest->position()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                      ,0x790,
                      "void absl::container_internal::btree_node<absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>]"
                     );
      }
      if (*(long *)this == *(long *)dest) {
        bVar2 = start(this);
        if ((uint)bVar2 == insert_position) {
          fVar1 = start(dest);
          bVar6 = (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                   )(fVar1 + (char)this[10] + 0xff);
        }
        else {
          bVar6 = (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                   )start(dest);
          if (insert_position != 0xf) {
            bVar2 = count(this);
            bVar6 = (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                     )((char)bVar6 + (bVar2 >> 1));
          }
        }
        dest[10] = bVar6;
        bVar6 = this[10];
        fVar1 = count(dest);
        this[10] = (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                    )((char)bVar6 - fVar1);
        fVar1 = count(this);
        if (fVar1 != '\0') {
          bVar2 = count(dest);
          bVar3 = start(dest);
          transfer_n(dest,(ulong)bVar2,(ulong)bVar3,(ulong)(byte)this[10],this,alloc);
          bVar6 = this[10];
          this[10] = (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                      )((char)bVar6 - 1U);
          local_30 = (map_slot_type<int,_const_google::protobuf::OneofDescriptor_*> *)
                     (this + (ulong)(byte)((char)bVar6 - 1U) * 0x10 + 0x10);
          btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>
          ::
          emplace_value<absl::lts_20250127::container_internal::map_slot_type<int,google::protobuf::OneofDescriptor_const*>*>
                    (*(btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>
                       **)this,(field_type)this[8],alloc,&local_30);
          pbVar5 = *(btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                     **)this;
          bVar6 = this[8];
          mutable_child(pbVar5,(char)bVar6 + '\x01');
          ppbVar4 = mutable_child(pbVar5,(char)bVar6 + '\x01');
          *ppbVar4 = dest;
          if (this[0xb] ==
              (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
               )0x0) {
            bVar6 = (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                     )start(dest);
            if ((byte)bVar6 <= (byte)dest[10]) {
              i = this[10];
              do {
                i = (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                     )((char)i + '\x01');
                pbVar5 = child(this,(field_type)i);
                if (pbVar5 == (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                               *)0x0) {
                  __assert_fail("child(j) != nullptr",
                                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                                ,0x7ad,
                                "void absl::container_internal::btree_node<absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>]"
                               );
                }
                pbVar5 = child(this,(field_type)i);
                init_child(dest,(field_type)bVar6,pbVar5);
                mutable_child(this,(field_type)i);
                bVar6 = (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                         )((char)bVar6 + 1);
              } while ((byte)bVar6 <= (byte)dest[10]);
            }
          }
          return;
        }
        __assert_fail("count() >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                      ,0x79f,
                      "void absl::container_internal::btree_node<absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>]"
                     );
      }
      __assert_fail("parent() == dest->parent()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                    ,0x791,
                    "void absl::container_internal::btree_node<absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>]"
                   );
    }
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<int, const google::protobuf::OneofDescriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 15, 16>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<int, const google::protobuf::OneofDescriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 15, 16>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
               );
}

Assistant:

void btree_node<P>::split(const int insert_position, btree_node *dest,
                          allocator_type *alloc) {
  assert(dest->count() == 0);
  assert(max_count() == kNodeSlots);
  assert(position() + 1 == dest->position());
  assert(parent() == dest->parent());

  // We bias the split based on the position being inserted. If we're
  // inserting at the beginning of the left node then bias the split to put
  // more values on the right node. If we're inserting at the end of the
  // right node then bias the split to put more values on the left node.
  if (insert_position == start()) {
    dest->set_finish(dest->start() + finish() - 1);
  } else if (insert_position == kNodeSlots) {
    dest->set_finish(dest->start());
  } else {
    dest->set_finish(dest->start() + count() / 2);
  }
  set_finish(finish() - dest->count());
  assert(count() >= 1);

  // Move values from the left sibling to the right sibling.
  dest->transfer_n(dest->count(), dest->start(), finish(), this, alloc);

  // The split key is the largest value in the left sibling.
  --mutable_finish();
  parent()->emplace_value(position(), alloc, finish_slot());
  value_destroy(finish(), alloc);
  parent()->set_child_noupdate_position(position() + 1, dest);

  if (is_internal()) {
    for (field_type i = dest->start(), j = finish() + 1; i <= dest->finish();
         ++i, ++j) {
      assert(child(j) != nullptr);
      dest->init_child(i, child(j));
      clear_child(j);
    }
  }
}